

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::processHexWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  uchar outputByte;
  int length;
  int lineNum_local;
  string *word_local;
  ostream *out_local;
  Binasc *this_local;
  
  iVar1 = std::__cxx11::string::size();
  if (2 < iVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
    poVar3 = std::operator<<(poVar3," at token: ");
    poVar3 = std::operator<<(poVar3,(string *)word);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Size of hexadecimal number is too large.  Max is ff.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return 0;
  }
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
  iVar2 = isxdigit((int)*pcVar4);
  if (iVar2 == 0) {
LAB_001569fe:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
    poVar3 = std::operator<<(poVar3," at token: ");
    poVar3 = std::operator<<(poVar3,(string *)word);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid character in hexadecimal number.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  else {
    if (iVar1 == 2) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
      iVar1 = isxdigit((int)*pcVar4);
      if (iVar1 == 0) goto LAB_001569fe;
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    lVar5 = strtol(pcVar4,(char **)0x0,0x10);
    std::operator<<(out,(uchar)lVar5);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Binasc::processHexWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();
	uchar outputByte;

	if (length > 2) {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "Size of hexadecimal number is too large.  Max is ff." << std::endl;
		return 0;
	}

	if (!isxdigit(word[0]) || (length == 2 && !isxdigit(word[1]))) {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "Invalid character in hexadecimal number." << std::endl;
		return 0;
	}

	outputByte = (uchar)strtol(word.c_str(), (char**)NULL, 16);
	out << outputByte;
	return 1;
}